

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe7At6(uint8_t *buf)

{
  ulong uVar1;
  ulong local_18;
  uint64_t res;
  uint8_t *buf_local;
  
  uVar1 = ((ulong)buf[1] & 0x1f) << 2;
  local_18 = (long)((int)(uint)*buf >> 6) | uVar1;
  if (uVar1 >> 6 != 0) {
    local_18 = local_18 | 0xffffffffffffff80;
  }
  return local_18;
}

Assistant:

std::int64_t readFlSIntLe7At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0x7f);

    if (res >> 6) {
        res |= UINT64_C(0xffffffffffffff80);
    }

    return static_cast<std::int64_t>(res);
}